

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.h
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* FastPForLib::split(string *str,string *del)

{
  ulong in_RDX;
  string *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t pos;
  size_t lastPos;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 uVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  string local_50 [32];
  long local_30;
  long local_28;
  undefined1 local_19;
  ulong local_18;
  string *local_10;
  
  local_19 = 0;
  this = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x108dda);
  local_28 = std::__cxx11::string::find_first_not_of(local_10,local_18);
  local_30 = std::__cxx11::string::find_first_of(local_10,local_18);
  while (uVar1 = local_30 != -1 || local_28 != -1, local_30 != -1 || local_28 != -1) {
    std::__cxx11::string::substr((ulong)local_50,(ulong)local_10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this,(value_type *)CONCAT17(uVar1,in_stack_ffffffffffffff88));
    std::__cxx11::string::~string(local_50);
    local_28 = std::__cxx11::string::find_first_not_of(local_10,local_18);
    local_30 = std::__cxx11::string::find_first_of(local_10,local_18);
  }
  return in_RDI;
}

Assistant:

std::vector<std::string> split(const std::string &str, const std::string &del) {
  std::vector<std::string> tokens;
  size_t lastPos = str.find_first_not_of(del, 0);
  size_t pos = str.find_first_of(del, lastPos);
  while (std::string::npos != pos || std::string::npos != lastPos) {
    tokens.push_back(str.substr(lastPos, pos - lastPos));
    lastPos = str.find_first_not_of(del, pos);
    pos = str.find_first_of(del, lastPos);
  }
  return tokens;
}